

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBranchLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *pvVar3;
  long lVar4;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  bool bVar6;
  LogMessage *pLVar7;
  long *plVar8;
  iterator iVar9;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *p_Var10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  long *plVar13;
  _Rb_tree_header **pp_Var14;
  size_type *psVar15;
  ulong *puVar16;
  Result *_result;
  int iVar17;
  undefined1 *nn;
  _Alloc_hider _Var18;
  RepeatedField<long> *this_00;
  undefined1 *puVar19;
  string current_blob_name;
  NeuralNetworkSpecValidator ifNNValidator;
  string condition;
  NeuralNetworkSpecValidator elseNNValidator;
  key_type local_270;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_250;
  undefined1 local_248 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_210;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_1e0;
  key_type local_1a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_188;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  long *local_160 [2];
  long local_150 [2];
  undefined1 local_140 [16];
  _Rb_tree_header *local_130;
  _Base_ptr p_Stack_128;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_d8;
  int *local_a0 [2];
  long local_90 [5];
  LogMessage local_68;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar6 = Result::good(__return_storage_ptr__);
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  local_248._8_8_ = 0;
  local_248._16_8_ = local_248._16_8_ & 0xffffffffffffff00;
  local_248._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_248 + 0x10);
  Result::Result(__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_248 + 0x10)) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  bVar6 = Result::good(__return_storage_ptr__);
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ != 0) {
    if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar7 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_248,pLVar7);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    pvVar3 = ((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0];
    if ((*(int *)((long)pvVar3 + 0x10) != 0) &&
       (this_00 = (RepeatedField<long> *)((long)pvVar3 + 0x10), 0 < this_00->current_size_)) {
      iVar17 = 0;
      do {
        plVar8 = google::protobuf::RepeatedField<long>::Get(this_00,iVar17);
        if (1 < *plVar8) {
          plVar8 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
          lVar4 = *plVar8;
          local_a0[0] = &((LogMessage *)local_a0)->line_;
          std::__cxx11::string::_M_construct<char*>((string *)local_a0,lVar4,plVar8[1] + lVar4);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)local_a0,0,(char *)0x0,0x3e39b4);
          pp_Var14 = (_Rb_tree_header **)(plVar8 + 2);
          if ((_Rb_tree_header **)*plVar8 == pp_Var14) {
            local_130 = *pp_Var14;
            p_Stack_128 = (_Base_ptr)plVar8[3];
            local_140._0_8_ = &local_130;
          }
          else {
            local_130 = *pp_Var14;
            local_140._0_8_ = (_Rb_tree_header **)*plVar8;
          }
          local_140._8_8_ = plVar8[1];
          *plVar8 = (long)pp_Var14;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append(local_140);
          local_248._0_8_ = local_248 + 0x10;
          puVar16 = (ulong *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar16) {
            local_248._16_8_ = *puVar16;
            local_248._24_8_ = plVar8[3];
          }
          else {
            local_248._16_8_ = *puVar16;
            local_248._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar8;
          }
          local_248._8_8_ = plVar8[1];
          *plVar8 = (long)puVar16;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((_Rb_tree_header **)local_140._0_8_ != &local_130) {
            operator_delete((void *)local_140._0_8_,
                            (ulong)((long)&(local_130->_M_header)._M_color + 1));
          }
          if (local_a0[0] != &((LogMessage *)local_a0)->line_) {
            operator_delete(local_a0[0],local_90[0] + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_248);
          local_1a8.field_2._M_allocated_capacity = local_248._16_8_;
          _Var18._M_p = (pointer)local_248._0_8_;
          if ((undefined1 *)local_248._0_8_ == local_248 + 0x10) {
            return __return_storage_ptr__;
          }
          goto LAB_00366929;
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 < this_00->current_size_);
    }
  }
  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_a0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_248,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a0);
  }
  plVar8 = (long *)((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  lVar4 = *plVar8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1a8,lVar4,plVar8[1] + lVar4);
  if (layer->_oneof_case_[0] == 0x25d) {
    puVar19 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar19 = Specification::_BranchLayerParams_default_instance_;
  }
  local_250 = &this->blobs;
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&local_250->_M_t,&local_1a8);
  if ((_Rb_tree_header *)iVar9._M_node == &(this->blobs)._M_t._M_impl.super__Rb_tree_header) {
    plVar8 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    lVar4 = *plVar8;
    local_160[0] = local_150;
    std::__cxx11::string::_M_construct<char*>((string *)local_160,lVar4,plVar8[1] + lVar4);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)local_160,0,(char *)0x0,0x3e39b4);
    plVar13 = plVar8 + 2;
    if ((long *)*plVar8 == plVar13) {
      local_170 = *plVar13;
      lStack_168 = plVar8[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar13;
      local_180 = (long *)*plVar8;
    }
    local_178 = plVar8[1];
    *plVar8 = (long)plVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_180);
    psVar15 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_270.field_2._M_allocated_capacity = *psVar15;
      local_270.field_2._8_8_ = plVar8[3];
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    }
    else {
      local_270.field_2._M_allocated_capacity = *psVar15;
      local_270._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_270._M_string_length = plVar8[1];
    *plVar8 = (long)psVar15;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_270,(ulong)local_1a8._M_dataplus._M_p);
    pp_Var14 = (_Rb_tree_header **)(plVar8 + 2);
    if ((_Rb_tree_header **)*plVar8 == pp_Var14) {
      local_130 = *pp_Var14;
      p_Stack_128 = (_Base_ptr)plVar8[3];
      local_140._0_8_ = &local_130;
    }
    else {
      local_130 = *pp_Var14;
      local_140._0_8_ = (_Rb_tree_header **)*plVar8;
    }
    local_140._8_8_ = plVar8[1];
    *plVar8 = (long)pp_Var14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append(local_140);
    local_248._0_8_ = local_248 + 0x10;
    puVar16 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_248._16_8_ = *puVar16;
      local_248._24_8_ = plVar8[3];
    }
    else {
      local_248._16_8_ = *puVar16;
      local_248._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar8;
    }
    local_248._8_8_ = plVar8[1];
    *plVar8 = (long)puVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((_Rb_tree_header **)local_140._0_8_ != &local_130) {
      operator_delete((void *)local_140._0_8_,(ulong)((long)&(local_130->_M_header)._M_color + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if (local_160[0] != local_150) {
      operator_delete(local_160[0],local_150[0] + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_248);
  }
  else {
    nn = (undefined1 *)(((ActivationParams *)puVar19)->NonlinearityType_).linear_;
    puVar19 = (undefined1 *)((InnerProductLayerParams *)puVar19)->bias_;
    if ((NeuralNetwork *)nn == (NeuralNetwork *)0x0) {
      nn = Specification::_NeuralNetwork_default_instance_;
    }
    if ((NeuralNetwork *)puVar19 == (NeuralNetwork *)0x0) {
      puVar19 = Specification::_NeuralNetwork_default_instance_;
    }
    if ((((NeuralNetwork *)nn)->layers_).super_RepeatedPtrFieldBase.current_size_ != 0) {
      iVar17 = (((NeuralNetwork *)puVar19)->layers_).super_RepeatedPtrFieldBase.current_size_;
      local_188 = &this->blobNameToRank;
      NeuralNetworkSpecValidator
                ((NeuralNetworkSpecValidator *)local_248,local_250,&this->ModelIOBlobNameToRank,
                 this->ndArrayInterpretation,this->loopStackDepth,local_188);
      validateNeuralNetwork<CoreML::Specification::NeuralNetwork>
                (__return_storage_ptr__,(NeuralNetworkSpecValidator *)local_248,(NeuralNetwork *)nn)
      ;
      bVar6 = Result::good(__return_storage_ptr__);
      if (bVar6) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        if (iVar17 < 1) {
LAB_003664b4:
          Result::Result(__return_storage_ptr__);
        }
        else {
          NeuralNetworkSpecValidator
                    ((NeuralNetworkSpecValidator *)local_140,local_250,&this->ModelIOBlobNameToRank,
                     this->ndArrayInterpretation,this->loopStackDepth,local_188);
          validateNeuralNetwork<CoreML::Specification::NeuralNetwork>
                    (__return_storage_ptr__,(NeuralNetworkSpecValidator *)local_140,
                     (NeuralNetwork *)puVar19);
          bVar6 = Result::good(__return_storage_ptr__);
          if (bVar6) {
            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != paVar1) {
              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
            }
            if ((_Rb_tree_header *)local_1e0._M_impl.super__Rb_tree_header._M_header._M_left !=
                &local_1e0._M_impl.super__Rb_tree_header) {
              p_Var12 = local_1e0._M_impl.super__Rb_tree_header._M_header._M_left;
              do {
                local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_270,*(long *)(p_Var12 + 1),
                           (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
                iVar9 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::find(&local_d8,&local_270);
                if (iVar9._M_node != &local_d8._M_impl.super__Rb_tree_header._M_header) {
                  p_Var10 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               ::operator[](local_250,&local_270);
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                          *)&local_1e0,&local_270);
                  _Var5._M_node = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                          *)&local_1e0,&local_270);
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                            (p_Var10,_Var5,
                             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )&(pmVar11->_M_t)._M_impl.super__Rb_tree_header);
                  p_Var10 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               ::operator[](local_250,&local_270);
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                          *)&local_d8,&local_270);
                  _Var5._M_node = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                          *)&local_d8,&local_270);
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                            (p_Var10,_Var5,
                             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )&(pmVar11->_M_t)._M_impl.super__Rb_tree_header);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._M_dataplus._M_p != &local_270.field_2) {
                  operator_delete(local_270._M_dataplus._M_p,
                                  local_270.field_2._M_allocated_capacity + 1);
                }
                p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
              } while ((_Rb_tree_header *)p_Var12 != &local_1e0._M_impl.super__Rb_tree_header);
            }
            ~NeuralNetworkSpecValidator((NeuralNetworkSpecValidator *)local_140);
            if (bVar6) goto LAB_003664b4;
          }
          else {
            ~NeuralNetworkSpecValidator((NeuralNetworkSpecValidator *)local_140);
          }
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&local_210);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)(local_248 + 8));
      goto LAB_0036690c;
    }
    plVar8 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    lVar4 = *plVar8;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_270,lVar4,plVar8[1] + lVar4);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,0x3e39b4);
    pp_Var14 = (_Rb_tree_header **)(plVar8 + 2);
    if ((_Rb_tree_header **)*plVar8 == pp_Var14) {
      local_130 = *pp_Var14;
      p_Stack_128 = (_Base_ptr)plVar8[3];
      local_140._0_8_ = &local_130;
    }
    else {
      local_130 = *pp_Var14;
      local_140._0_8_ = (_Rb_tree_header **)*plVar8;
    }
    local_140._8_8_ = plVar8[1];
    *plVar8 = (long)pp_Var14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append(local_140);
    local_248._0_8_ = local_248 + 0x10;
    puVar16 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_248._16_8_ = *puVar16;
      local_248._24_8_ = plVar8[3];
    }
    else {
      local_248._16_8_ = *puVar16;
      local_248._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar8;
    }
    local_248._8_8_ = plVar8[1];
    *plVar8 = (long)puVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((_Rb_tree_header **)local_140._0_8_ != &local_130) {
      operator_delete((void *)local_140._0_8_,(ulong)((long)&(local_130->_M_header)._M_color + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_248);
  }
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
LAB_0036690c:
  _Var18._M_p = local_1a8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
LAB_00366929:
    operator_delete(_Var18._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBranchLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 0, 0));

    if (layer.inputtensor_size()) {
        auto &in_tensor = layer.inputtensor(0);
        if (in_tensor.dimvalue_size()) {
            for (int i=0; i < in_tensor.dimvalue_size(); i++) {
                if (in_tensor.dimvalue(i) > 1) {
                    std::string err = "Branch Layer '" + std::string(layer.name()) + "' input's length cannot be more than 1";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    std::string condition = layer.input(0);

    const auto& params = layer.branch();
    // check that condition is already present in the network
    if (blobs.find(condition) == blobs.end()) {
        std::string err = "Branch Layer '" + std::string(layer.name()) + "' requires the condition blob '"
        + condition + "' which is not present in the network prior to this layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // get the NN spec for If and Else branches
    const auto& ifNNSpec = params.ifbranch();
    const auto& elseNNSpec = params.elsebranch();
    if (ifNNSpec.layers_size() == 0) {
        std::string err = "Branch Layer '" + std::string(layer.name()) + "' has an empty If branch";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    bool isElseBranch = (elseNNSpec.layers_size() > 0) ? true : false;

    // validate both If and Else branches
    NeuralNetworkSpecValidator ifNNValidator(blobs, ModelIOBlobNameToRank, ndArrayInterpretation, loopStackDepth, blobNameToRank);
    HANDLE_RESULT_AND_RETURN_ON_ERROR(ifNNValidator.validateNeuralNetwork(ifNNSpec));

    if (isElseBranch) {
        NeuralNetworkSpecValidator elseNNValidator(blobs, ModelIOBlobNameToRank, ndArrayInterpretation, loopStackDepth, blobNameToRank);
        HANDLE_RESULT_AND_RETURN_ON_ERROR(elseNNValidator.validateNeuralNetwork(elseNNSpec));

        // update set of "blobs" of the current Neural Network: the ones that are in both if and else branches
        for (auto& blob_map: ifNNValidator.blobs){
            std::string current_blob_name = blob_map.first;
            if (elseNNValidator.blobs.find(current_blob_name) != elseNNValidator.blobs.end()){
                // if we are here, this means "current_blob_name" is present in both if and else branch
                blobs[current_blob_name].insert(ifNNValidator.blobs[current_blob_name].begin(),
                                                ifNNValidator.blobs[current_blob_name].end());
                blobs[current_blob_name].insert(elseNNValidator.blobs[current_blob_name].begin(),
                                                elseNNValidator.blobs[current_blob_name].end());
            }
        }
    }

    return Result();
}